

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  float fVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImVec2 IVar4;
  undefined4 unaff_retaddr;
  ImGuiCond unaff_retaddr_00;
  ImVec2 *in_stack_00000008;
  ImVec2 pos;
  ImGuiWindow *moving_window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffd8;
  float local_18;
  float fStack_14;
  ImGuiWindow *window;
  
  pIVar2 = GImGui;
  if (GImGui->MovingWindow == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    if (GImGui->ActiveIdWindow->MoveId != GImGui->ActiveId) {
      return;
    }
    KeepAliveID(GImGui->ActiveId);
    if (((pIVar2->IO).MouseDown[0] & 1U) != 0) {
      return;
    }
    ClearActiveID();
    return;
  }
  KeepAliveID(GImGui->ActiveId);
  bVar3 = false;
  if (pIVar2->MovingWindow != (ImGuiWindow *)0x0) {
    bVar3 = pIVar2->MovingWindow->RootWindow != (ImGuiWindow *)0x0;
  }
  if (!bVar3) {
    __assert_fail("g.MovingWindow && g.MovingWindow->RootWindow",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0xd49,"void ImGui::UpdateMouseMovingWindowNewFrame()");
  }
  window = pIVar2->MovingWindow->RootWindow;
  if ((((pIVar2->IO).MouseDown[0] & 1U) == 0) || (bVar3 = IsMousePosValid((ImVec2 *)window), !bVar3)
     ) {
    ClearActiveID();
    pIVar2->MovingWindow = (ImGuiWindow *)0x0;
    return;
  }
  IVar4 = ::operator-(in_stack_ffffffffffffffd8,(ImVec2 *)0x1d478e);
  fVar1 = (window->Pos).x;
  local_18 = IVar4.x;
  if ((fVar1 == local_18) && (!NAN(fVar1) && !NAN(local_18))) {
    fVar1 = (window->Pos).y;
    fStack_14 = IVar4.y;
    if ((fVar1 == fStack_14) && (!NAN(fVar1) && !NAN(fStack_14))) goto LAB_001d47da;
  }
  MarkIniSettingsDirty(window);
  SetWindowPos((ImGuiWindow *)pos,in_stack_00000008,unaff_retaddr_00);
LAB_001d47da:
  FocusWindow((ImGuiWindow *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}